

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void CloseWindow(void)

{
  MsfGifResult result;
  MsfGifResult local_28;
  
  if (gifRecording == '\x01') {
    msf_gif_end(&local_28,&gifState);
    if (local_28.data != (void *)0x0) {
      free(local_28.data);
    }
    gifRecording = '\0';
  }
  UnloadFontDefault();
  rlglClose();
  glfwDestroyWindow(platform.handle);
  glfwTerminate();
  CORE.Window.ready = false;
  TraceLog(3,"Window closed successfully");
  return;
}

Assistant:

void CloseWindow(void)
{
#if defined(SUPPORT_GIF_RECORDING)
    if (gifRecording)
    {
        MsfGifResult result = msf_gif_end(&gifState);
        msf_gif_free(result);
        gifRecording = false;
    }
#endif

#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_DEFAULT_FONT)
    UnloadFontDefault();        // WARNING: Module required: rtext
#endif

    rlglClose();                // De-init rlgl

    // De-initialize platform
    //--------------------------------------------------------------
    ClosePlatform();
    //--------------------------------------------------------------

    CORE.Window.ready = false;
    TRACELOG(LOG_INFO, "Window closed successfully");
}